

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

bool __thiscall QRenderRule::hasModification(QRenderRule *this)

{
  QStyleSheetBorderData *pQVar1;
  QStyleSheetOutlineData *pQVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  
  bVar5 = true;
  if ((this->pal).d.ptr == (QStyleSheetPaletteData *)0x0) {
    if ((this->bg).d.ptr != (QStyleSheetBackgroundData *)0x0) {
      cVar4 = QPixmap::isNull();
      if (cVar4 == '\0') {
        return true;
      }
      if (*(int *)(*(long *)&((this->bg).d.ptr)->brush + 4) != 0) {
        return true;
      }
    }
    pQVar1 = (this->bd).d.ptr;
    if ((((pQVar1 == (QStyleSheetBorderData *)0x0) ||
         (((pQVar1->bi).d.ptr == (QStyleSheetBorderImageData *)0x0 &&
          (pQVar1->styles[0] == BorderStyle_Native)))) &&
        ((pQVar2 = (this->ou).d.ptr, pQVar2 == (QStyleSheetOutlineData *)0x0 ||
         (((pQVar2->super_QStyleSheetBorderData).bi.d.ptr == (QStyleSheetBorderImageData *)0x0 &&
          ((pQVar2->super_QStyleSheetBorderData).styles[0] == BorderStyle_Native)))))) &&
       ((((this->b).d.ptr == (QStyleSheetBoxData *)0x0 &&
         ((((this->p).d.ptr == (QStyleSheetPositionData *)0x0 &&
           ((this->geo).d.ptr == (QStyleSheetGeometryData *)0x0)) &&
          ((this->img).d.ptr == (QStyleSheetImageData *)0x0)))) && (this->hasFont == false)))) {
      pDVar3 = (this->styleHints).d;
      if (pDVar3 == (Data *)0x0) {
        bVar5 = false;
      }
      else {
        bVar5 = pDVar3->size != 0;
      }
    }
  }
  return bVar5;
}

Assistant:

bool QRenderRule::hasModification() const
{
    return hasPalette() ||
           hasBackground() ||
           hasGradientBackground() ||
           !hasNativeBorder() ||
           !hasNativeOutline() ||
           hasBox() ||
           hasPosition() ||
           hasGeometry() ||
           hasImage() ||
           hasFont ||
           !styleHints.isEmpty();
}